

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
::iterator::operator*(iterator *this)

{
  long *plVar1;
  ctrl_t *pcVar2;
  long *plVar3;
  reference ppVar4;
  long lVar5;
  undefined8 *in_RCX;
  long *in_RSI;
  undefined8 *in_R8;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    in_RCX = (undefined8 *)(kEmptyGroup + 0x10);
    if (pcVar2 != kEmptyGroup + 0x10) {
      if (kSentinel < *pcVar2) {
        return (reference)(this->field_1).slot_;
      }
      goto LAB_001b1634;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
  ::iterator::operator*((iterator *)this);
LAB_001b1634:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
  ::iterator::operator*((iterator *)this);
  in_RCX = (undefined8 *)*in_RCX;
  plVar3 = (long *)*in_R8;
  *in_RSI = (long)(in_RSI + 2);
  plVar1 = in_RCX + 2;
  if ((long *)*in_RCX == plVar1) {
    lVar5 = in_RCX[3];
    in_RSI[2] = *plVar1;
    in_RSI[3] = lVar5;
  }
  else {
    *in_RSI = (long)*in_RCX;
    in_RSI[2] = *plVar1;
  }
  in_RSI[1] = in_RCX[1];
  *in_RCX = plVar1;
  in_RCX[1] = 0;
  *(undefined1 *)(in_RCX + 2) = 0;
  in_RSI[4] = *plVar3;
  in_RSI[5] = plVar3[1];
  in_RSI[6] = plVar3[2];
  plVar3[2] = 0;
  *plVar3 = 0;
  plVar3[1] = 0;
  in_RSI[7] = (long)(in_RSI + 9);
  plVar1 = plVar3 + 5;
  if ((long *)plVar3[3] == plVar1) {
    lVar5 = plVar3[6];
    in_RSI[9] = *plVar1;
    in_RSI[10] = lVar5;
  }
  else {
    in_RSI[7] = plVar3[3];
    in_RSI[9] = *plVar1;
  }
  in_RSI[8] = plVar3[4];
  plVar3[3] = (long)plVar1;
  plVar3[4] = 0;
  *(undefined1 *)(plVar3 + 5) = 0;
  ppVar4 = (reference)plVar3[7];
  in_RSI[0xb] = (long)ppVar4;
  return ppVar4;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }